

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O2

btVector3 * btShapeHull::getUnitSpherePoints(void)

{
  int iVar1;
  
  if ((getUnitSpherePoints()::sUnitSpherePoints == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getUnitSpherePoints()::sUnitSpherePoints), iVar1 != 0)) {
    getUnitSpherePoints::sUnitSpherePoints[0].m_floats[0] = _DAT_001b19d0;
    getUnitSpherePoints::sUnitSpherePoints[0].m_floats[1] = _UNK_001b19d4;
    getUnitSpherePoints::sUnitSpherePoints[0].m_floats[2] = _UNK_001b19d8;
    getUnitSpherePoints::sUnitSpherePoints[0].m_floats[3] = _UNK_001b19dc;
    getUnitSpherePoints::sUnitSpherePoints[1].m_floats[0] = _DAT_001b19e0;
    getUnitSpherePoints::sUnitSpherePoints[1].m_floats[1] = _UNK_001b19e4;
    getUnitSpherePoints::sUnitSpherePoints[1].m_floats[2] = _UNK_001b19e8;
    getUnitSpherePoints::sUnitSpherePoints[1].m_floats[3] = _UNK_001b19ec;
    getUnitSpherePoints::sUnitSpherePoints[2].m_floats[0] = _DAT_001b19f0;
    getUnitSpherePoints::sUnitSpherePoints[2].m_floats[1] = _UNK_001b19f4;
    getUnitSpherePoints::sUnitSpherePoints[2].m_floats[2] = _UNK_001b19f8;
    getUnitSpherePoints::sUnitSpherePoints[2].m_floats[3] = _UNK_001b19fc;
    getUnitSpherePoints::sUnitSpherePoints[3].m_floats[0] = _DAT_001b1a00;
    getUnitSpherePoints::sUnitSpherePoints[3].m_floats[1] = _UNK_001b1a04;
    getUnitSpherePoints::sUnitSpherePoints[3].m_floats[2] = _UNK_001b1a08;
    getUnitSpherePoints::sUnitSpherePoints[3].m_floats[3] = _UNK_001b1a0c;
    getUnitSpherePoints::sUnitSpherePoints[4].m_floats[0] = _DAT_001b1a10;
    getUnitSpherePoints::sUnitSpherePoints[4].m_floats[1] = _UNK_001b1a14;
    getUnitSpherePoints::sUnitSpherePoints[4].m_floats[2] = _UNK_001b1a18;
    getUnitSpherePoints::sUnitSpherePoints[4].m_floats[3] = _UNK_001b1a1c;
    getUnitSpherePoints::sUnitSpherePoints[5].m_floats[0] = _DAT_001b1a20;
    getUnitSpherePoints::sUnitSpherePoints[5].m_floats[1] = _UNK_001b1a24;
    getUnitSpherePoints::sUnitSpherePoints[5].m_floats[2] = _UNK_001b1a28;
    getUnitSpherePoints::sUnitSpherePoints[5].m_floats[3] = _UNK_001b1a2c;
    getUnitSpherePoints::sUnitSpherePoints[6].m_floats[0] = _DAT_001b1a30;
    getUnitSpherePoints::sUnitSpherePoints[6].m_floats[1] = _UNK_001b1a34;
    getUnitSpherePoints::sUnitSpherePoints[6].m_floats[2] = _UNK_001b1a38;
    getUnitSpherePoints::sUnitSpherePoints[6].m_floats[3] = _UNK_001b1a3c;
    getUnitSpherePoints::sUnitSpherePoints[7].m_floats[0] = _DAT_001b1a40;
    getUnitSpherePoints::sUnitSpherePoints[7].m_floats[1] = _UNK_001b1a44;
    getUnitSpherePoints::sUnitSpherePoints[7].m_floats[2] = _UNK_001b1a48;
    getUnitSpherePoints::sUnitSpherePoints[7].m_floats[3] = _UNK_001b1a4c;
    getUnitSpherePoints::sUnitSpherePoints[8].m_floats[0] = _DAT_001b1a50;
    getUnitSpherePoints::sUnitSpherePoints[8].m_floats[1] = _UNK_001b1a54;
    getUnitSpherePoints::sUnitSpherePoints[8].m_floats[2] = _UNK_001b1a58;
    getUnitSpherePoints::sUnitSpherePoints[8].m_floats[3] = _UNK_001b1a5c;
    getUnitSpherePoints::sUnitSpherePoints[9].m_floats[0] = _DAT_001b1a60;
    getUnitSpherePoints::sUnitSpherePoints[9].m_floats[1] = _UNK_001b1a64;
    getUnitSpherePoints::sUnitSpherePoints[9].m_floats[2] = _UNK_001b1a68;
    getUnitSpherePoints::sUnitSpherePoints[9].m_floats[3] = _UNK_001b1a6c;
    getUnitSpherePoints::sUnitSpherePoints[10].m_floats[0] = _DAT_001b1a70;
    getUnitSpherePoints::sUnitSpherePoints[10].m_floats[1] = _UNK_001b1a74;
    getUnitSpherePoints::sUnitSpherePoints[10].m_floats[2] = _UNK_001b1a78;
    getUnitSpherePoints::sUnitSpherePoints[10].m_floats[3] = _UNK_001b1a7c;
    getUnitSpherePoints::sUnitSpherePoints[0xb].m_floats[0] = _DAT_001b1a80;
    getUnitSpherePoints::sUnitSpherePoints[0xb].m_floats[1] = _UNK_001b1a84;
    getUnitSpherePoints::sUnitSpherePoints[0xb].m_floats[2] = _UNK_001b1a88;
    getUnitSpherePoints::sUnitSpherePoints[0xb].m_floats[3] = _UNK_001b1a8c;
    getUnitSpherePoints::sUnitSpherePoints[0xc].m_floats[0] = _DAT_001b1a90;
    getUnitSpherePoints::sUnitSpherePoints[0xc].m_floats[1] = _UNK_001b1a94;
    getUnitSpherePoints::sUnitSpherePoints[0xc].m_floats[2] = _UNK_001b1a98;
    getUnitSpherePoints::sUnitSpherePoints[0xc].m_floats[3] = _UNK_001b1a9c;
    getUnitSpherePoints::sUnitSpherePoints[0xd].m_floats[0] = _DAT_001b1aa0;
    getUnitSpherePoints::sUnitSpherePoints[0xd].m_floats[1] = _UNK_001b1aa4;
    getUnitSpherePoints::sUnitSpherePoints[0xd].m_floats[2] = _UNK_001b1aa8;
    getUnitSpherePoints::sUnitSpherePoints[0xd].m_floats[3] = _UNK_001b1aac;
    getUnitSpherePoints::sUnitSpherePoints[0xe].m_floats[0] = _DAT_001b1ab0;
    getUnitSpherePoints::sUnitSpherePoints[0xe].m_floats[1] = _UNK_001b1ab4;
    getUnitSpherePoints::sUnitSpherePoints[0xe].m_floats[2] = _UNK_001b1ab8;
    getUnitSpherePoints::sUnitSpherePoints[0xe].m_floats[3] = _UNK_001b1abc;
    getUnitSpherePoints::sUnitSpherePoints[0xf].m_floats[0] = _DAT_001b1ac0;
    getUnitSpherePoints::sUnitSpherePoints[0xf].m_floats[1] = _UNK_001b1ac4;
    getUnitSpherePoints::sUnitSpherePoints[0xf].m_floats[2] = _UNK_001b1ac8;
    getUnitSpherePoints::sUnitSpherePoints[0xf].m_floats[3] = _UNK_001b1acc;
    getUnitSpherePoints::sUnitSpherePoints[0x10].m_floats[0] = _DAT_001b1ad0;
    getUnitSpherePoints::sUnitSpherePoints[0x10].m_floats[1] = _UNK_001b1ad4;
    getUnitSpherePoints::sUnitSpherePoints[0x10].m_floats[2] = _UNK_001b1ad8;
    getUnitSpherePoints::sUnitSpherePoints[0x10].m_floats[3] = _UNK_001b1adc;
    getUnitSpherePoints::sUnitSpherePoints[0x11].m_floats[0] = _DAT_001b1ae0;
    getUnitSpherePoints::sUnitSpherePoints[0x11].m_floats[1] = _UNK_001b1ae4;
    getUnitSpherePoints::sUnitSpherePoints[0x11].m_floats[2] = _UNK_001b1ae8;
    getUnitSpherePoints::sUnitSpherePoints[0x11].m_floats[3] = _UNK_001b1aec;
    getUnitSpherePoints::sUnitSpherePoints[0x12].m_floats[0] = _DAT_001b1af0;
    getUnitSpherePoints::sUnitSpherePoints[0x12].m_floats[1] = _UNK_001b1af4;
    getUnitSpherePoints::sUnitSpherePoints[0x12].m_floats[2] = _UNK_001b1af8;
    getUnitSpherePoints::sUnitSpherePoints[0x12].m_floats[3] = _UNK_001b1afc;
    getUnitSpherePoints::sUnitSpherePoints[0x13].m_floats[0] = _DAT_001b1b00;
    getUnitSpherePoints::sUnitSpherePoints[0x13].m_floats[1] = _UNK_001b1b04;
    getUnitSpherePoints::sUnitSpherePoints[0x13].m_floats[2] = _UNK_001b1b08;
    getUnitSpherePoints::sUnitSpherePoints[0x13].m_floats[3] = _UNK_001b1b0c;
    getUnitSpherePoints::sUnitSpherePoints[0x14].m_floats[0] = _DAT_001b1b10;
    getUnitSpherePoints::sUnitSpherePoints[0x14].m_floats[1] = _UNK_001b1b14;
    getUnitSpherePoints::sUnitSpherePoints[0x14].m_floats[2] = _UNK_001b1b18;
    getUnitSpherePoints::sUnitSpherePoints[0x14].m_floats[3] = _UNK_001b1b1c;
    getUnitSpherePoints::sUnitSpherePoints[0x15].m_floats[0] = _DAT_001b1b20;
    getUnitSpherePoints::sUnitSpherePoints[0x15].m_floats[1] = _UNK_001b1b24;
    getUnitSpherePoints::sUnitSpherePoints[0x15].m_floats[2] = _UNK_001b1b28;
    getUnitSpherePoints::sUnitSpherePoints[0x15].m_floats[3] = _UNK_001b1b2c;
    getUnitSpherePoints::sUnitSpherePoints[0x16].m_floats =
         (btScalar  [4])ZEXT816(0x3e9e36f43f737889);
    getUnitSpherePoints::sUnitSpherePoints[0x17].m_floats =
         (btScalar  [4])ZEXT816(0xbe9e36f43f737889);
    getUnitSpherePoints::sUnitSpherePoints[0x18].m_floats =
         (btScalar  [4])ZEXT816(0xbf4f1bbd3f167925);
    getUnitSpherePoints::sUnitSpherePoints[0x19].m_floats =
         (btScalar  [4])ZEXT816(0xbf80000000000000);
    getUnitSpherePoints::sUnitSpherePoints[0x1a].m_floats =
         (btScalar  [4])ZEXT816(0xbf4f1bbdbf167925);
    getUnitSpherePoints::sUnitSpherePoints[0x1b].m_floats[0] = _DAT_001b1b70;
    getUnitSpherePoints::sUnitSpherePoints[0x1b].m_floats[1] = _UNK_001b1b74;
    getUnitSpherePoints::sUnitSpherePoints[0x1b].m_floats[2] = _UNK_001b1b78;
    getUnitSpherePoints::sUnitSpherePoints[0x1b].m_floats[3] = _UNK_001b1b7c;
    getUnitSpherePoints::sUnitSpherePoints[0x1c].m_floats[0] = _DAT_001b1b80;
    getUnitSpherePoints::sUnitSpherePoints[0x1c].m_floats[1] = _UNK_001b1b84;
    getUnitSpherePoints::sUnitSpherePoints[0x1c].m_floats[2] = _UNK_001b1b88;
    getUnitSpherePoints::sUnitSpherePoints[0x1c].m_floats[3] = _UNK_001b1b8c;
    getUnitSpherePoints::sUnitSpherePoints[0x1d].m_floats[0] = _DAT_001b1b90;
    getUnitSpherePoints::sUnitSpherePoints[0x1d].m_floats[1] = _UNK_001b1b94;
    getUnitSpherePoints::sUnitSpherePoints[0x1d].m_floats[2] = _UNK_001b1b98;
    getUnitSpherePoints::sUnitSpherePoints[0x1d].m_floats[3] = _UNK_001b1b9c;
    getUnitSpherePoints::sUnitSpherePoints[0x1e].m_floats[0] = _DAT_001b1ba0;
    getUnitSpherePoints::sUnitSpherePoints[0x1e].m_floats[1] = _UNK_001b1ba4;
    getUnitSpherePoints::sUnitSpherePoints[0x1e].m_floats[2] = _UNK_001b1ba8;
    getUnitSpherePoints::sUnitSpherePoints[0x1e].m_floats[3] = _UNK_001b1bac;
    getUnitSpherePoints::sUnitSpherePoints[0x1f].m_floats[0] = _DAT_001b1bb0;
    getUnitSpherePoints::sUnitSpherePoints[0x1f].m_floats[1] = _UNK_001b1bb4;
    getUnitSpherePoints::sUnitSpherePoints[0x1f].m_floats[2] = _UNK_001b1bb8;
    getUnitSpherePoints::sUnitSpherePoints[0x1f].m_floats[3] = _UNK_001b1bbc;
    getUnitSpherePoints::sUnitSpherePoints[0x20].m_floats[0] = _DAT_001b1bc0;
    getUnitSpherePoints::sUnitSpherePoints[0x20].m_floats[1] = _UNK_001b1bc4;
    getUnitSpherePoints::sUnitSpherePoints[0x20].m_floats[2] = _UNK_001b1bc8;
    getUnitSpherePoints::sUnitSpherePoints[0x20].m_floats[3] = _UNK_001b1bcc;
    getUnitSpherePoints::sUnitSpherePoints[0x21].m_floats[0] = _DAT_001b1bd0;
    getUnitSpherePoints::sUnitSpherePoints[0x21].m_floats[1] = _UNK_001b1bd4;
    getUnitSpherePoints::sUnitSpherePoints[0x21].m_floats[2] = _UNK_001b1bd8;
    getUnitSpherePoints::sUnitSpherePoints[0x21].m_floats[3] = _UNK_001b1bdc;
    getUnitSpherePoints::sUnitSpherePoints[0x22].m_floats[0] = _DAT_001b1be0;
    getUnitSpherePoints::sUnitSpherePoints[0x22].m_floats[1] = _UNK_001b1be4;
    getUnitSpherePoints::sUnitSpherePoints[0x22].m_floats[2] = _UNK_001b1be8;
    getUnitSpherePoints::sUnitSpherePoints[0x22].m_floats[3] = _UNK_001b1bec;
    getUnitSpherePoints::sUnitSpherePoints[0x23].m_floats[0] = _DAT_001b1bf0;
    getUnitSpherePoints::sUnitSpherePoints[0x23].m_floats[1] = _UNK_001b1bf4;
    getUnitSpherePoints::sUnitSpherePoints[0x23].m_floats[2] = _UNK_001b1bf8;
    getUnitSpherePoints::sUnitSpherePoints[0x23].m_floats[3] = _UNK_001b1bfc;
    getUnitSpherePoints::sUnitSpherePoints[0x24].m_floats[0] = _DAT_001b1c00;
    getUnitSpherePoints::sUnitSpherePoints[0x24].m_floats[1] = _UNK_001b1c04;
    getUnitSpherePoints::sUnitSpherePoints[0x24].m_floats[2] = _UNK_001b1c08;
    getUnitSpherePoints::sUnitSpherePoints[0x24].m_floats[3] = _UNK_001b1c0c;
    getUnitSpherePoints::sUnitSpherePoints[0x25].m_floats[0] = _DAT_001b1c10;
    getUnitSpherePoints::sUnitSpherePoints[0x25].m_floats[1] = _UNK_001b1c14;
    getUnitSpherePoints::sUnitSpherePoints[0x25].m_floats[2] = _UNK_001b1c18;
    getUnitSpherePoints::sUnitSpherePoints[0x25].m_floats[3] = _UNK_001b1c1c;
    getUnitSpherePoints::sUnitSpherePoints[0x26].m_floats[0] = _DAT_001b1c20;
    getUnitSpherePoints::sUnitSpherePoints[0x26].m_floats[1] = _UNK_001b1c24;
    getUnitSpherePoints::sUnitSpherePoints[0x26].m_floats[2] = _UNK_001b1c28;
    getUnitSpherePoints::sUnitSpherePoints[0x26].m_floats[3] = _UNK_001b1c2c;
    getUnitSpherePoints::sUnitSpherePoints[0x27].m_floats[0] = _DAT_001b1c30;
    getUnitSpherePoints::sUnitSpherePoints[0x27].m_floats[1] = _UNK_001b1c34;
    getUnitSpherePoints::sUnitSpherePoints[0x27].m_floats[2] = _UNK_001b1c38;
    getUnitSpherePoints::sUnitSpherePoints[0x27].m_floats[3] = _UNK_001b1c3c;
    getUnitSpherePoints::sUnitSpherePoints[0x28].m_floats[0] = _DAT_001b1c40;
    getUnitSpherePoints::sUnitSpherePoints[0x28].m_floats[1] = _UNK_001b1c44;
    getUnitSpherePoints::sUnitSpherePoints[0x28].m_floats[2] = _UNK_001b1c48;
    getUnitSpherePoints::sUnitSpherePoints[0x28].m_floats[3] = _UNK_001b1c4c;
    getUnitSpherePoints::sUnitSpherePoints[0x29].m_floats[0] = _DAT_001b1c50;
    getUnitSpherePoints::sUnitSpherePoints[0x29].m_floats[1] = _UNK_001b1c54;
    getUnitSpherePoints::sUnitSpherePoints[0x29].m_floats[2] = _UNK_001b1c58;
    getUnitSpherePoints::sUnitSpherePoints[0x29].m_floats[3] = _UNK_001b1c5c;
    __cxa_guard_release(&getUnitSpherePoints()::sUnitSpherePoints);
  }
  return getUnitSpherePoints::sUnitSpherePoints;
}

Assistant:

btVector3* btShapeHull::getUnitSpherePoints()
{
	static btVector3 sUnitSpherePoints[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2] = 
	{
		btVector3(btScalar(0.000000) , btScalar(-0.000000),btScalar(-1.000000)),
		btVector3(btScalar(0.723608) , btScalar(-0.525725),btScalar(-0.447219)),
		btVector3(btScalar(-0.276388) , btScalar(-0.850649),btScalar(-0.447219)),
		btVector3(btScalar(-0.894426) , btScalar(-0.000000),btScalar(-0.447216)),
		btVector3(btScalar(-0.276388) , btScalar(0.850649),btScalar(-0.447220)),
		btVector3(btScalar(0.723608) , btScalar(0.525725),btScalar(-0.447219)),
		btVector3(btScalar(0.276388) , btScalar(-0.850649),btScalar(0.447220)),
		btVector3(btScalar(-0.723608) , btScalar(-0.525725),btScalar(0.447219)),
		btVector3(btScalar(-0.723608) , btScalar(0.525725),btScalar(0.447219)),
		btVector3(btScalar(0.276388) , btScalar(0.850649),btScalar(0.447219)),
		btVector3(btScalar(0.894426) , btScalar(0.000000),btScalar(0.447216)),
		btVector3(btScalar(-0.000000) , btScalar(0.000000),btScalar(1.000000)),
		btVector3(btScalar(0.425323) , btScalar(-0.309011),btScalar(-0.850654)),
		btVector3(btScalar(-0.162456) , btScalar(-0.499995),btScalar(-0.850654)),
		btVector3(btScalar(0.262869) , btScalar(-0.809012),btScalar(-0.525738)),
		btVector3(btScalar(0.425323) , btScalar(0.309011),btScalar(-0.850654)),
		btVector3(btScalar(0.850648) , btScalar(-0.000000),btScalar(-0.525736)),
		btVector3(btScalar(-0.525730) , btScalar(-0.000000),btScalar(-0.850652)),
		btVector3(btScalar(-0.688190) , btScalar(-0.499997),btScalar(-0.525736)),
		btVector3(btScalar(-0.162456) , btScalar(0.499995),btScalar(-0.850654)),
		btVector3(btScalar(-0.688190) , btScalar(0.499997),btScalar(-0.525736)),
		btVector3(btScalar(0.262869) , btScalar(0.809012),btScalar(-0.525738)),
		btVector3(btScalar(0.951058) , btScalar(0.309013),btScalar(0.000000)),
		btVector3(btScalar(0.951058) , btScalar(-0.309013),btScalar(0.000000)),
		btVector3(btScalar(0.587786) , btScalar(-0.809017),btScalar(0.000000)),
		btVector3(btScalar(0.000000) , btScalar(-1.000000),btScalar(0.000000)),
		btVector3(btScalar(-0.587786) , btScalar(-0.809017),btScalar(0.000000)),
		btVector3(btScalar(-0.951058) , btScalar(-0.309013),btScalar(-0.000000)),
		btVector3(btScalar(-0.951058) , btScalar(0.309013),btScalar(-0.000000)),
		btVector3(btScalar(-0.587786) , btScalar(0.809017),btScalar(-0.000000)),
		btVector3(btScalar(-0.000000) , btScalar(1.000000),btScalar(-0.000000)),
		btVector3(btScalar(0.587786) , btScalar(0.809017),btScalar(-0.000000)),
		btVector3(btScalar(0.688190) , btScalar(-0.499997),btScalar(0.525736)),
		btVector3(btScalar(-0.262869) , btScalar(-0.809012),btScalar(0.525738)),
		btVector3(btScalar(-0.850648) , btScalar(0.000000),btScalar(0.525736)),
		btVector3(btScalar(-0.262869) , btScalar(0.809012),btScalar(0.525738)),
		btVector3(btScalar(0.688190) , btScalar(0.499997),btScalar(0.525736)),
		btVector3(btScalar(0.525730) , btScalar(0.000000),btScalar(0.850652)),
		btVector3(btScalar(0.162456) , btScalar(-0.499995),btScalar(0.850654)),
		btVector3(btScalar(-0.425323) , btScalar(-0.309011),btScalar(0.850654)),
		btVector3(btScalar(-0.425323) , btScalar(0.309011),btScalar(0.850654)),
		btVector3(btScalar(0.162456) , btScalar(0.499995),btScalar(0.850654))
	};
	return sUnitSpherePoints;
}